

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_to_binary_tree_inc.h
# Opt level: O0

void InitializeH10(HasherHandle handle,BrotliEncoderParams *params)

{
  H10 *self;
  BrotliEncoderParams *params_local;
  HasherHandle handle_local;
  
  *(ulong *)(handle + 0x28) = (ulong)((1 << ((byte)params->lgwin & 0x1f)) - 1);
  *(int *)(handle + 0x80030) = -(int)*(ulong *)(handle + 0x28);
  return;
}

Assistant:

static void FN(Initialize)(
    HasherHandle handle, const BrotliEncoderParams* params) {
  HashToBinaryTree* self = FN(Self)(handle);
  self->window_mask_ = (1u << params->lgwin) - 1u;
  self->invalid_pos_ = (uint32_t)(0 - self->window_mask_);
}